

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_color
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,level_enum color_level,
          string_view_t color)

{
  string *__return_storage_ptr__;
  undefined1 local_48 [48];
  
  local_48._8_8_ = color.size_;
  local_48._0_8_ = color.data_;
  __return_storage_ptr__ = (string *)(local_48 + 0x10);
  to_string__abi_cxx11_
            (__return_storage_ptr__,(ansicolor_sink<spdlog::details::console_nullmutex> *)local_48,
             (string_view_t *)local_48._0_8_);
  std::__cxx11::string::operator=
            ((string *)((this->colors_)._M_elems + (int)color_level),
             (string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[static_cast<size_t>(color_level)] = to_string_(color);
}